

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cend
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  _Map_pointer ppuVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  _Elt_pointer pfVar4;
  _Elt_pointer pfVar5;
  _Map_pointer ppfVar6;
  unsigned_long __n;
  _Self *__tmp;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  
  ppuVar1 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppuVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar3 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if (index < ((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar3 >> 3) +
              ((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppuVar1 - (long)ppuVar2) >> 3) - 1) +
              (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40) {
    pfVar4 = (this->entries).
             super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
    pfVar5 = (this->entries).
             super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppfVar6 = (this->entries).
              super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    uVar8 = ((long)puVar3 -
             (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + index;
    if (uVar8 < 0x40) {
      puVar9 = puVar3 + index;
    }
    else {
      uVar7 = uVar8 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar8) {
        uVar7 = uVar8 >> 6;
      }
      puVar9 = ppuVar2[uVar7] + uVar8 + uVar7 * -0x40;
    }
    __n = *puVar9;
    __return_storage_ptr__->_M_cur =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    __return_storage_ptr__->_M_first = pfVar4;
    __return_storage_ptr__->_M_last = pfVar5;
    __return_storage_ptr__->_M_node = ppfVar6;
    std::_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
    ::operator+=(__return_storage_ptr__,__n);
    return __return_storage_ptr__;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xaf,
                "typename std::deque<ValueType>::const_iterator compressed_sparse_matrix<filtration_entry_t>::cend(size_t) const [ValueType = filtration_entry_t]"
               );
}

Assistant:

typename std::deque<ValueType>::const_iterator cend(size_t index) const {
		assert(index < size());
		return entries.cbegin() + bounds[index];
	}